

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O2

void license::LicenseGenerator::printHelp(char *prog_name,options_description *options)

{
  ostream *poVar1;
  
  std::endl<char,std::char_traits<char>>((ostream *)std::cout);
  poVar1 = std::operator<<((ostream *)std::cout,prog_name);
  poVar1 = std::operator<<(poVar1," Version ");
  poVar1 = std::operator<<(poVar1,"1.1.0");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,". Usage:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)std::cout,prog_name);
  poVar1 = std::operator<<(poVar1," [options] product_name1 product_name2 ... ");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)std::cout,
                           " product_name1 ... = Product name. This string must match the one passed by the software."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)boost::program_options::operator<<((ostream *)std::cout,options);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void LicenseGenerator::printHelp(const char* prog_name,
		const po::options_description& options) {
	cout << endl;
	cout << prog_name << " Version " << PROJECT_VERSION << endl << ". Usage:"
			<< endl;
	cout << prog_name << " [options] product_name1 product_name2 ... " << endl
			<< endl;
	cout
			<< " product_name1 ... = Product name. This string must match the one passed by the software."
			<< endl;
	cout << options << endl;
}